

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

uintptr_t http_sse_subscribe(http_sse_s *sse_,http_sse_subscribe_args args)

{
  subscribe_args_s args_00;
  size_t *psVar1;
  int *piVar2;
  subscription_s *obj;
  void *in_stack_ffffffffffffff60;
  fio_ls_s *pos;
  subscription_s *sub;
  http_sse_subscribe_args *udata;
  http_sse_internal_s *sse;
  http_sse_s *sse__local;
  
  if (sse_[1].on_open == (_func_void_http_sse_s_ptr *)0xffffffffffffffff) {
    sse__local = (http_sse_s *)0x0;
  }
  else {
    psVar1 = (size_t *)fio_malloc(0x38);
    if (psVar1 == (size_t *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/http.c:1283"
                      );
      }
      kill(0,2);
      piVar2 = __errno_location();
      exit(*piVar2);
    }
    psVar1[6] = (size_t)args.match;
    psVar1[4] = (size_t)args.on_unsubscribe;
    psVar1[5] = (size_t)args.udata;
    psVar1[2] = (size_t)args.channel.data;
    psVar1[3] = (size_t)args.on_message;
    *psVar1 = args.channel.capa;
    psVar1[1] = args.channel.len;
    LOCK();
    sse_[2].on_shutdown = sse_[2].on_shutdown + 1;
    UNLOCK();
    args_00.channel.data = (char *)args.match;
    args_00._0_24_ = args.channel;
    args_00.match = http_sse_on_message;
    args_00.on_message = http_sse_on_unsubscribe;
    args_00.on_unsubscribe = (_func_void_void_ptr_void_ptr *)sse_;
    args_00.udata1 = psVar1;
    args_00.udata2 = in_stack_ffffffffffffff60;
    obj = fio_subscribe(args_00);
    if (obj == (subscription_s *)0x0) {
      sse__local = (http_sse_s *)0x0;
    }
    else {
      fio_lock((fio_lock_i *)&sse_[2].on_ready);
      sse__local = (http_sse_s *)fio_ls_push((fio_ls_s *)&sse_[1].on_close,obj);
      fio_unlock((fio_lock_i *)&sse_[2].on_ready);
    }
  }
  return (uintptr_t)sse__local;
}

Assistant:

uintptr_t http_sse_subscribe(http_sse_s *sse_,
                             struct http_sse_subscribe_args args) {
  http_sse_internal_s *sse = FIO_LS_EMBD_OBJ(http_sse_internal_s, sse, sse_);
  if (sse->uuid == -1)
    return 0;
  if (!args.on_message)
    args.on_message = http_sse_on_message__direct;
  struct http_sse_subscribe_args *udata = fio_malloc(sizeof(*udata));
  FIO_ASSERT_ALLOC(udata);
  *udata = args;

  fio_atomic_add(&sse->ref, 1);
  subscription_s *sub =
      fio_subscribe(.channel = args.channel, .on_message = http_sse_on_message,
                    .on_unsubscribe = http_sse_on_unsubscribe, .udata1 = sse,
                    .udata2 = udata, .match = args.match);
  if (!sub)
    return 0;

  fio_lock(&sse->lock);
  fio_ls_s *pos = fio_ls_push(&sse->subscriptions, sub);
  fio_unlock(&sse->lock);
  return (uintptr_t)pos;
}